

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

bool __thiscall adios2::ADIOS::RemoveIO(ADIOS *this,string *name)

{
  element_type *peVar1;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"for io name ",name);
  std::operator+(&bStack_78,&local_38,", in call to ADIOS::RemoveIO");
  CheckPointer(this,&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  peVar1 = (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string(local_58,(string *)name);
  uVar2 = adios2::core::ADIOS::RemoveIO(peVar1,local_58);
  std::__cxx11::string::~string(local_58);
  return (bool)uVar2;
}

Assistant:

bool ADIOS::RemoveIO(const std::string name)
{
    CheckPointer("for io name " + name + ", in call to ADIOS::RemoveIO");
    return m_ADIOS->RemoveIO(name);
}